

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::CopyImage::MissMatchObjectTest::iterate(MissMatchObjectTest *this)

{
  int iVar1;
  GLuint GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  size_type sVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_260;
  GetNameFunc local_250;
  int local_248;
  Enum<int,_2UL> local_240;
  GetNameFunc local_230;
  int local_228;
  Enum<int,_2UL> local_220;
  GetNameFunc local_210;
  int local_208;
  Enum<int,_2UL> local_200;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0;
  MessageBuilder local_1d0;
  Exception *exc;
  reference local_38;
  testCase *test_case;
  byte local_25;
  GLuint temp;
  bool result;
  long lStack_20;
  IterateResult it_result;
  Functions *gl;
  MissMatchObjectTest *pMStack_10;
  GLenum error;
  MissMatchObjectTest *this_local;
  
  gl._4_4_ = 0;
  pMStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  temp = 0;
  local_25 = 0;
  test_case._4_4_ = 0;
  local_38 = std::
             vector<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
             ::operator[](&this->m_test_cases,(ulong)this->m_test_case_index);
  if (local_38->m_obj_target == 0x8d41) {
    GVar2 = Utils::prepareRenderBuffer((this->super_TestCase).m_context,0x8058);
    this->m_dst_name = GVar2;
    GVar2 = Utils::prepareRenderBuffer((this->super_TestCase).m_context,0x8058);
    this->m_src_name = GVar2;
  }
  else {
    GVar2 = Utils::prepareTex16x16x6
                      ((this->super_TestCase).m_context,local_38->m_obj_target,0x8058,0x1908,0x1401,
                       (GLuint *)((long)&test_case + 4));
    this->m_dst_name = GVar2;
    GVar2 = Utils::prepareTex16x16x6
                      ((this->super_TestCase).m_context,local_38->m_obj_target,0x8058,0x1908,0x1401,
                       (GLuint *)((long)&test_case + 4));
    this->m_src_name = GVar2;
    Utils::makeTextureComplete
              ((this->super_TestCase).m_context,local_38->m_obj_target,this->m_dst_name,0,0);
    Utils::makeTextureComplete
              ((this->super_TestCase).m_context,local_38->m_obj_target,this->m_src_name,0,0);
  }
  (**(code **)(lStack_20 + 0x310))
            (this->m_src_name,local_38->m_src_target,0,0,0,0,this->m_dst_name,local_38->m_dst_target
             ,0,0,0,0,1,1,1);
  gl._4_4_ = (**(code **)(lStack_20 + 0x800))();
  local_25 = local_38->m_expected_result == gl._4_4_;
  clean(this);
  if ((local_25 & 1) == 1) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_PASS,"Pass");
    this->m_test_case_index = this->m_test_case_index + 1;
    sVar5 = std::
            vector<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
            ::size(&this->m_test_cases);
    if (this->m_test_case_index < sVar5) {
      temp = 1;
    }
  }
  else {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_00 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [27])"Failure. Expected result: ")
    ;
    EVar7 = glu::getErrorStr(local_38->m_expected_result);
    local_1f0 = EVar7.m_getName;
    local_1e8 = EVar7.m_value;
    local_1e0.m_getName = local_1f0;
    local_1e0.m_value = local_1e8;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1e0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2b39b91);
    EVar7 = glu::getErrorStr(gl._4_4_);
    local_210 = EVar7.m_getName;
    local_208 = EVar7.m_value;
    local_200.m_getName = local_210;
    local_200.m_value = local_208;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_200);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])". Object target: ");
    EVar7 = glu::getTextureTargetStr(local_38->m_obj_target);
    local_230 = EVar7.m_getName;
    local_228 = EVar7.m_value;
    local_220.m_getName = local_230;
    local_220.m_value = local_228;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_220);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])". Source target: ");
    EVar7 = glu::getTextureTargetStr(local_38->m_src_target);
    local_250 = EVar7.m_getName;
    local_248 = EVar7.m_value;
    local_240.m_getName = local_250;
    local_240.m_value = local_248;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_240);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [23])". Destination target: ");
    EVar7 = glu::getTextureTargetStr(local_38->m_dst_target);
    local_260.m_getName = EVar7.m_getName;
    local_260.m_value = EVar7.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_260);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,"Fail");
  }
  return temp;
}

Assistant:

tcu::TestNode::IterateResult MissMatchObjectTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	GLuint						 temp	  = 0;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare objects */
		if (GL_RENDERBUFFER == test_case.m_obj_target)
		{
			m_dst_name = Utils::prepareRenderBuffer(m_context, GL_RGBA8);
			m_src_name = Utils::prepareRenderBuffer(m_context, GL_RGBA8);
		}
		else
		{
			m_dst_name =
				Utils::prepareTex16x16x6(m_context, test_case.m_obj_target, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, temp);
			m_src_name =
				Utils::prepareTex16x16x6(m_context, test_case.m_obj_target, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, temp);

			/* Make textures complete */
			Utils::makeTextureComplete(m_context, test_case.m_obj_target, m_dst_name, 0 /* base */, 0 /* max */);
			Utils::makeTextureComplete(m_context, test_case.m_obj_target, m_src_name, 0 /* base */, 0 /* max */);
		}
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_name, test_case.m_src_target, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */, 0 /* srcZ */,
						m_dst_name, test_case.m_dst_target, 0 /* dstLevel */, 0 /* dstX */, 0 /* dstY */, 0 /* dstZ */,
						1 /* srcWidth */, 1 /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Remove resources */
	clean();

	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error)
			<< ". Object target: " << glu::getTextureTargetStr(test_case.m_obj_target)
			<< ". Source target: " << glu::getTextureTargetStr(test_case.m_src_target)
			<< ". Destination target: " << glu::getTextureTargetStr(test_case.m_dst_target) << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}